

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

bool is_placeholder_or_list(Am_Value *v)

{
  bool bVar1;
  Am_Value *in_value;
  bool local_89;
  Am_Object local_70;
  byte local_61;
  Am_Object local_60;
  undefined1 local_58 [8];
  Am_Value subv;
  Am_Value_List l;
  Am_Object local_28;
  Am_Object local_20;
  Am_Value *local_18;
  Am_Value *v_local;
  
  local_18 = v;
  bVar1 = Am_Value::Valid(v);
  if (bVar1) {
    if (local_18->type == 0xa001) {
      Am_Object::Am_Object(&local_20,local_18);
      Am_Object::Am_Object(&local_28,&Am_A_Placeholder);
      bVar1 = Am_Object::Is_Instance_Of(&local_20,&local_28);
      Am_Object::~Am_Object(&local_28);
      Am_Object::~Am_Object(&local_20);
      if (bVar1) {
        v_local._7_1_ = 1;
        goto LAB_002d75c1;
      }
    }
    else {
      bVar1 = Am_Value_List::Test(local_18);
      if (bVar1) {
        Am_Value_List::Am_Value_List((Am_Value_List *)&subv.value,local_18);
        Am_Value::Am_Value((Am_Value *)local_58);
        Am_Value_List::Start((Am_Value_List *)&subv.value);
        while (bVar1 = Am_Value_List::Last((Am_Value_List *)&subv.value), ((bVar1 ^ 0xffU) & 1) != 0
              ) {
          in_value = Am_Value_List::Get((Am_Value_List *)&subv.value);
          Am_Value::operator=((Am_Value *)local_58,in_value);
          local_61 = 0;
          local_89 = false;
          if (local_58._0_2_ == 0xa001) {
            Am_Object::Am_Object(&local_60,(Am_Value *)local_58);
            local_61 = 1;
            Am_Object::Am_Object(&local_70,&Am_A_Placeholder);
            local_89 = Am_Object::Is_Instance_Of(&local_60,&local_70);
            Am_Object::~Am_Object(&local_70);
          }
          if ((local_61 & 1) != 0) {
            Am_Object::~Am_Object(&local_60);
          }
          if (local_89 != false) {
            v_local._7_1_ = 1;
            bVar1 = true;
            goto LAB_002d7586;
          }
          Am_Value_List::Next((Am_Value_List *)&subv.value);
        }
        bVar1 = false;
LAB_002d7586:
        Am_Value::~Am_Value((Am_Value *)local_58);
        Am_Value_List::~Am_Value_List((Am_Value_List *)&subv.value);
        if (bVar1) goto LAB_002d75c1;
      }
    }
  }
  v_local._7_1_ = 0;
LAB_002d75c1:
  return (bool)(v_local._7_1_ & 1);
}

Assistant:

bool
is_placeholder_or_list(Am_Value &v)
{
  if (v.Valid()) {
    if (v.type == Am_OBJECT) {
      if (Am_Object(v).Is_Instance_Of(Am_A_Placeholder))
        return true;
    } else if (Am_Value_List::Test(v)) {
      Am_Value_List l = v;
      Am_Value subv;
      for (l.Start(); !l.Last(); l.Next()) {
        subv = l.Get();
        if (subv.type == Am_OBJECT &&
            Am_Object(subv).Is_Instance_Of(Am_A_Placeholder))
          return true;
      }
    }
  }
  return false;
}